

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O0

output_type __thiscall
testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::generate
          (Arbitrary<std::forward_list<int,_std::allocator<int>_>_> *this,size_t generation,
          unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  front_insert_iterator<std::forward_list<int,_std::allocator<int>_>_> __first;
  ulong uVar1;
  size_t n;
  unsigned_long local_20;
  unsigned_long randomSeed_local;
  size_t generation_local;
  output_type *v;
  
  local_20 = randomSeed;
  randomSeed_local = generation;
  generation_local = (size_t)this;
  ::std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)this);
  if (randomSeed_local != 0) {
    uVar1 = randomSeed_local / 100;
    __first = ::std::front_inserter<std::forward_list<int,std::allocator<int>>>
                        ((forward_list<int,_std::allocator<int>_> *)this);
    __gen.randomSeed = &local_20;
    __gen.generation = &randomSeed_local;
    ::std::
    generate_n<std::front_insert_iterator<std::forward_list<int,std::allocator<int>>>,unsigned_long,testinator::Arbitrary<std::forward_list<int,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              (__first,uVar1 * 5 + 5,__gen);
  }
  return (_Fwd_list_base<int,_std::allocator<int>_>)(_Fwd_list_base<int,_std::allocator<int>_>)this;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::size_t n = N * ((generation / 100) + 1);
      std::generate_n(std::front_inserter(v), n,
                      [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }